

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

int main(void)

{
  SqStack s;
  undefined8 *puVar1;
  undefined4 in_stack_fffffffffffffff4;
  
  puVar1 = (undefined8 *)malloc(400);
  if (puVar1 == (undefined8 *)0x0) {
    printf(anon_var_dwarf_2b);
  }
  *puVar1 = 0x200000001;
  puVar1[1] = 0x400000003;
  s.top = (ElementType *)(puVar1 + 2);
  s.base = (ElementType *)puVar1;
  s.stacksize = 100;
  s._20_4_ = in_stack_fffffffffffffff4;
  PrintStackData(s);
  conversion();
  LineEdit();
  return 0;
}

Assistant:

int main(){
    SqStack S;
    S = InitStack(S);
    S = Push(S,1);
    S = Push(S,2);
    S = Push(S,3);
    S = Push(S,4);
    PrintStackData(S);
    conversion(10);
    LineEdit();
    return 0;
}